

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property_string.c
# Opt level: O0

OSSL_PROPERTY_IDX ossl_property_value(OSSL_LIB_CTX *ctx,char *s,int create)

{
  void *pvVar1;
  undefined4 in_EDX;
  OSSL_PROPERTY_IDX *in_RSI;
  PROP_TABLE *in_RDI;
  PROPERTY_STRING_DATA *propdata;
  OSSL_LIB_CTX_METHOD *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  OSSL_LIB_CTX *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  OSSL_PROPERTY_IDX OVar2;
  
  pvVar1 = ossl_lib_ctx_get_data
                     (in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                      in_stack_ffffffffffffffc8);
  if (pvVar1 == (void *)0x0) {
    OVar2 = 0;
  }
  else {
    OVar2 = ossl_property_string
                      ((CRYPTO_RWLOCK *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
                       (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  }
  return OVar2;
}

Assistant:

OSSL_PROPERTY_IDX ossl_property_value(OSSL_LIB_CTX *ctx, const char *s,
                                      int create)
{
    PROPERTY_STRING_DATA *propdata
        = ossl_lib_ctx_get_data(ctx, OSSL_LIB_CTX_PROPERTY_STRING_INDEX,
                                &property_string_data_method);

    if (propdata == NULL)
        return 0;
    return ossl_property_string(propdata->lock, propdata->prop_values,
                                create ? &propdata->prop_value_idx : NULL,
                                s);
}